

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O2

void __thiscall
jpge::jpeg_encoder::optimize_huffman_table(jpeg_encoder *this,int table_num,int table_len)

{
  int *piVar1;
  uint8 (*pauVar2) [17];
  uint8 uVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  sym_freq *psVar7;
  byte bVar8;
  uint uVar9;
  uint8 (*pauVar10) [256];
  uint uVar11;
  uint *puVar12;
  long lVar13;
  int iVar14;
  ulong uVar15;
  sym_freq *psVar16;
  uint uVar17;
  uint uVar18;
  int iVar19;
  uint32 *puVar20;
  long lVar21;
  int iVar22;
  long lVar23;
  uint uVar24;
  ulong uVar25;
  uint i;
  ulong uVar26;
  sym_freq *psVar27;
  int *piVar28;
  bool bVar29;
  int num_codes [33];
  int aiStack_2048 [256];
  int aiStack_1c48 [256];
  uint local_1848 [256];
  uint auStack_1448 [256];
  sym_freq syms0 [257];
  sym_freq syms1 [257];
  
  piVar28 = num_codes;
  syms0[0].m_key = 1;
  syms0[0].m_sym_index = 0;
  uVar6 = 0;
  uVar26 = (ulong)(uint)table_len;
  if (table_len < 1) {
    uVar26 = uVar6;
  }
  uVar25 = 1;
LAB_001123d1:
  puVar20 = this->m_huff_count[table_num] + uVar6;
  for (lVar13 = 0; uVar24 = (uint)uVar25, uVar6 - uVar26 != lVar13; lVar13 = lVar13 + -1) {
    if (*puVar20 != 0) goto LAB_001123f1;
    puVar20 = puVar20 + 1;
  }
  memset(num_codes,0,0x1000);
  for (uVar26 = 0; uVar25 != uVar26; uVar26 = uVar26 + 1) {
    uVar9 = syms0[uVar26].m_key;
    num_codes[uVar9 & 0xff] = num_codes[uVar9 & 0xff] + 1;
    piVar1 = (int *)((long)aiStack_2048 + (ulong)(uVar9 >> 6 & 0x3fc));
    *piVar1 = *piVar1 + 1;
    piVar1 = (int *)((long)aiStack_1c48 + (ulong)(uVar9 >> 0xe & 0x3fc));
    *piVar1 = *piVar1 + 1;
    piVar1 = (int *)((long)local_1848 + (ulong)(uVar9 >> 0x16 & 0xfffffffc));
    *piVar1 = *piVar1 + 1;
  }
  puVar12 = local_1848;
  uVar9 = 1;
  for (uVar26 = 4; 1 < uVar26; uVar26 = uVar26 - 1) {
    if (*puVar12 != uVar24) {
      uVar9 = (uint)uVar26;
      break;
    }
    puVar12 = puVar12 + -0x100;
  }
  bVar8 = 0;
  psVar7 = syms1;
  psVar27 = syms0;
  for (uVar26 = 0; psVar16 = psVar7, uVar26 != uVar9; uVar26 = uVar26 + 1) {
    uVar17 = 0;
    for (lVar13 = 0; lVar13 != 0x100; lVar13 = lVar13 + 1) {
      auStack_1448[lVar13] = uVar17;
      uVar17 = uVar17 + *(int *)((long)piVar28 + lVar13 * 4);
    }
    for (uVar6 = 0; uVar25 != uVar6; uVar6 = uVar6 + 1) {
      uVar18 = psVar27[uVar6].m_key >> (bVar8 & 0x1f) & 0xff;
      uVar17 = auStack_1448[uVar18];
      auStack_1448[uVar18] = uVar17 + 1;
      psVar16[uVar17] = psVar27[uVar6];
    }
    bVar8 = bVar8 + 8;
    piVar28 = (int *)((long)piVar28 + 0x400);
    psVar7 = psVar27;
    psVar27 = psVar16;
  }
  if (uVar24 != 0) {
    if (uVar24 == 1) {
      psVar27->m_key = 1;
    }
    else {
      psVar27->m_key = psVar27->m_key + psVar27[1].m_key;
      iVar5 = uVar24 - 1;
      iVar4 = 2;
      iVar14 = 0;
      for (lVar13 = 1; lVar13 < iVar5; lVar13 = lVar13 + 1) {
        lVar21 = (long)iVar14;
        if ((iVar4 < (int)uVar24) &&
           (lVar23 = (long)iVar4, psVar27[lVar23].m_key <= psVar27[lVar21].m_key)) {
          iVar4 = iVar4 + 1;
          psVar27[lVar13].m_key = psVar27[lVar23].m_key;
        }
        else {
          psVar27[lVar13].m_key = psVar27[lVar21].m_key;
          iVar14 = iVar14 + 1;
          psVar27[lVar21].m_key = (uint)lVar13;
          lVar21 = (long)iVar14;
        }
        if (iVar4 < (int)uVar24) {
          if (lVar21 < lVar13) {
            uVar9 = psVar27[lVar21].m_key;
            uVar17 = psVar27[iVar4].m_key;
            if (uVar9 < uVar17) goto LAB_001126e1;
          }
          else {
            uVar17 = psVar27[iVar4].m_key;
          }
          iVar4 = iVar4 + 1;
          psVar27[lVar13].m_key = psVar27[lVar13].m_key + uVar17;
        }
        else {
          uVar9 = psVar27[lVar21].m_key;
LAB_001126e1:
          psVar27[lVar13].m_key = psVar27[lVar13].m_key + uVar9;
          iVar14 = iVar14 + 1;
          psVar27[lVar21].m_key = (uint)lVar13;
        }
      }
      uVar9 = uVar24 - 2;
      psVar27[(long)(int)uVar24 + -2].m_key = 0;
      for (uVar17 = uVar24 - 3; -1 < (int)uVar17; uVar17 = uVar17 - 1) {
        psVar27[uVar17].m_key = psVar27[psVar27[uVar17].m_key].m_key + 1;
      }
      uVar11 = 0;
      iVar4 = 1;
      while (iVar4 != 0) {
        uVar17 = 0xffffffff;
        if ((int)uVar9 < -1) {
          uVar17 = uVar9;
        }
        iVar14 = uVar9 - uVar17;
        iVar22 = 0;
        while ((uVar18 = uVar17, iVar19 = iVar14, iVar22 != iVar14 &&
               (uVar18 = uVar9, iVar19 = iVar22, psVar27[uVar9].m_key == uVar11))) {
          iVar22 = iVar22 + 1;
          uVar9 = uVar9 - 1;
        }
        uVar9 = uVar18;
        psVar7 = psVar27 + iVar5;
        for (; iVar19 < iVar4; iVar4 = iVar4 + -1) {
          psVar7->m_key = uVar11;
          iVar5 = iVar5 + -1;
          psVar7 = psVar7 + -1;
        }
        uVar11 = uVar11 + 1;
        iVar4 = iVar19 * 2;
      }
    }
  }
  memset(num_codes,0,0x84);
  psVar7 = psVar27;
  while (bVar29 = uVar25 != 0, uVar25 = uVar25 - 1, bVar29) {
    num_codes[psVar7->m_key] = num_codes[psVar7->m_key] + 1;
    psVar7 = psVar7 + 1;
  }
  if (1 < uVar24) {
    for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
      num_codes[0x10] = num_codes[0x10] + num_codes[lVar13 + 0x11];
    }
    piVar28 = num_codes + 0x10;
    iVar4 = 0;
    for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
      iVar4 = iVar4 + (*piVar28 << ((byte)lVar13 & 0x1f));
      piVar28 = piVar28 + -1;
    }
    for (; iVar4 != 0x10000; iVar4 = iVar4 + -1) {
      num_codes[0x10] = num_codes[0x10] + -1;
      uVar9 = 0xf;
      uVar26 = 0xf;
      do {
        uVar6 = uVar26;
        bVar29 = uVar9 == 0;
        uVar9 = uVar9 - 1;
        if (bVar29) goto LAB_00112669;
        uVar26 = (ulong)uVar9;
      } while (num_codes[uVar6] == 0);
      num_codes[uVar6] = num_codes[uVar6] + -1;
      num_codes[uVar6 + 1] = num_codes[uVar6 + 1] + 2;
LAB_00112669:
    }
  }
  pauVar2 = this->m_huff_bits + table_num;
  *(uint8 *)((long)pauVar2 + 0) = '\0';
  *(uint8 *)((long)pauVar2 + 1) = '\0';
  *(uint8 *)((long)pauVar2 + 2) = '\0';
  *(uint8 *)((long)pauVar2 + 3) = '\0';
  *(uint8 *)((long)pauVar2 + 4) = '\0';
  *(uint8 *)((long)pauVar2 + 5) = '\0';
  *(uint8 *)((long)pauVar2 + 6) = '\0';
  *(uint8 *)((long)pauVar2 + 7) = '\0';
  *(uint8 *)((long)pauVar2 + 8) = '\0';
  *(uint8 *)((long)pauVar2 + 9) = '\0';
  *(uint8 *)((long)pauVar2 + 10) = '\0';
  *(uint8 *)((long)pauVar2 + 0xb) = '\0';
  *(uint8 *)((long)pauVar2 + 0xc) = '\0';
  *(uint8 *)((long)pauVar2 + 0xd) = '\0';
  *(uint8 *)((long)pauVar2 + 0xe) = '\0';
  *(uint8 *)((long)pauVar2 + 0xf) = '\0';
  this->m_huff_bits[table_num][0x10] = '\0';
  for (lVar13 = 0; lVar13 != 0x10; lVar13 = lVar13 + 1) {
    this->m_huff_bits[table_num][lVar13 + 1] = (uint8)num_codes[lVar13 + 1];
  }
  uVar9 = 0x10;
  uVar26 = 0x10;
  do {
    uVar6 = uVar26;
    bVar29 = uVar9 == 0;
    uVar9 = uVar9 - 1;
    if (bVar29) goto LAB_001125c1;
    uVar3 = this->m_huff_bits[table_num][uVar6];
    uVar26 = (ulong)uVar9;
  } while (uVar3 == '\0');
  this->m_huff_bits[table_num][uVar6] = uVar3 + 0xff;
LAB_001125c1:
  pauVar10 = this->m_huff_val + table_num;
  for (lVar13 = (long)(int)(uVar24 - 1); 0 < lVar13; lVar13 = lVar13 + -1) {
    (*pauVar10)[0] = (char)psVar27[lVar13].m_sym_index + 0xff;
    pauVar10 = (uint8 (*) [256])(*pauVar10 + 1);
  }
  return;
LAB_001123f1:
  uVar15 = uVar25 & 0xffffffff;
  syms0[uVar15].m_key = *puVar20;
  uVar6 = (uVar6 - lVar13) + 1;
  uVar25 = uVar25 + 1;
  syms0[uVar15].m_sym_index = (uint)uVar6;
  goto LAB_001123d1;
}

Assistant:

void jpeg_encoder::optimize_huffman_table(int table_num, int table_len)
{
  sym_freq syms0[MAX_HUFF_SYMBOLS], syms1[MAX_HUFF_SYMBOLS];
  syms0[0].m_key = 1; syms0[0].m_sym_index = 0;  // dummy symbol, assures that no valid code contains all 1's
  int num_used_syms = 1;
  const uint32 *pSym_count = &m_huff_count[table_num][0];
  for (int i = 0; i < table_len; i++)
    if (pSym_count[i]) { syms0[num_used_syms].m_key = pSym_count[i]; syms0[num_used_syms++].m_sym_index = i + 1; }
  sym_freq* pSyms = radix_sort_syms(num_used_syms, syms0, syms1);
  calculate_minimum_redundancy(pSyms, num_used_syms);

  // Count the # of symbols of each code size.
  int num_codes[1 + MAX_HUFF_CODESIZE]; clear_obj(num_codes);
  for (int i = 0; i < num_used_syms; i++)
    num_codes[pSyms[i].m_key]++;

  const uint JPGE_CODE_SIZE_LIMIT = 16; // the maximum possible size of a JPEG Huffman code (valid range is [9,16] - 9 vs. 8 because of the dummy symbol)
  huffman_enforce_max_code_size(num_codes, num_used_syms, JPGE_CODE_SIZE_LIMIT);

  // Compute m_huff_bits array, which contains the # of symbols per code size.
  clear_obj(m_huff_bits[table_num]);
  for (int i = 1; i <= (int)JPGE_CODE_SIZE_LIMIT; i++)
    m_huff_bits[table_num][i] = static_cast<uint8>(num_codes[i]);

  // Remove the dummy symbol added above, which must be in largest bucket.
  for (int i = JPGE_CODE_SIZE_LIMIT; i >= 1; i--)
  {
    if (m_huff_bits[table_num][i]) { m_huff_bits[table_num][i]--; break; }
  }

  // Compute the m_huff_val array, which contains the symbol indices sorted by code size (smallest to largest).
  for (int i = num_used_syms - 1; i >= 1; i--)
    m_huff_val[table_num][num_used_syms - 1 - i] = static_cast<uint8>(pSyms[i].m_sym_index - 1);
}